

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O0

optional<Array2D<unsigned_int>_> * __thiscall WFC::run(WFC *this)

{
  ObserveStatus OVar1;
  Array2D<unsigned_int> *in_RDI;
  WFC *in_stack_00000028;
  ObserveStatus result;
  Propagator *in_stack_00000050;
  Array2D<unsigned_int> *this_00;
  WFC *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  while( true ) {
    OVar1 = observe(in_stack_00000028);
    if (OVar1 == failure) {
      std::optional<Array2D<unsigned_int>_>::optional((optional<Array2D<unsigned_int>_> *)in_RDI);
      return (optional<Array2D<unsigned_int>_> *)this_00;
    }
    if (OVar1 == success) break;
    Propagator::propagate(in_stack_00000050,(Wave *)this);
  }
  wave_to_output(in_stack_ffffffffffffffd8);
  std::optional<Array2D<unsigned_int>_>::optional<Array2D<unsigned_int>,_true>
            ((optional<Array2D<unsigned_int>_> *)this_00,in_RDI);
  Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)0x1142d4);
  return (optional<Array2D<unsigned_int>_> *)this_00;
}

Assistant:

std::optional<Array2D<unsigned>> WFC::run() noexcept {
  while (true) {

    // Define the value of an undefined cell.
    ObserveStatus result = observe();

    // Check if the algorithm has terminated.
    if (result == failure) {
      return std::nullopt;
    } else if (result == success) {
      return wave_to_output();
    }

    // Propagate the information.
    propagator.propagate(wave);
  }
}